

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Matrix * viewport(Matrix *__return_storage_ptr__,int x,int y,int w,int h)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  reference pvVar2;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Matrix *m;
  
  Matrix::identity(__return_storage_ptr__,4);
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = (float)x + (float)w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = (float)y + (float)h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,3);
  *pvVar2 = 127.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,0);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,0);
  *pvVar2 = (float)w * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,1);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,1);
  *pvVar2 = (float)h * 0.5;
  pvVar1 = Matrix::operator[](__return_storage_ptr__,2);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](pvVar1,2);
  *pvVar2 = 127.5;
  return __return_storage_ptr__;
}

Assistant:

Matrix viewport(int x, int y, int w, int h) {
    Matrix m = Matrix::identity(4);
    m[0][3] = x+w/2.f;
    m[1][3] = y+h/2.f;
    m[2][3] = depth/2.f;

    m[0][0] = w/2.f;
    m[1][1] = h/2.f;
    m[2][2] = depth/2.f;
    return m;
}